

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O0

bool __thiscall
boost::runtime::value_interpreter<bool,_false>::interpret
          (value_interpreter<bool,_false> *this,cstring *param_name,cstring *source)

{
  bool bVar1;
  int iVar2;
  basic_cstring<const_char> *in_RDX;
  basic_cstring<const_char> *in_RSI;
  basic_cstring<const_char> *in_stack_fffffffffffffdf0;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
  *in_stack_fffffffffffffe08;
  basic_cstring<const_char> *in_stack_fffffffffffffe10;
  basic_cstring<const_char> *in_stack_fffffffffffffe18;
  basic_cstring<const_char> *in_stack_fffffffffffffe20;
  basic_cstring<const_char> *in_stack_fffffffffffffe40;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
  *in_stack_fffffffffffffe48;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  basic_cstring<const_char> local_b0;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80;
  basic_cstring<const_char> local_70;
  basic_cstring<const_char> local_60;
  basic_cstring<const_char> local_50 [5];
  
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_YES == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_YES), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_YES);
  }
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_Y == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_Y), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_Y);
  }
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_NO == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_NO), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_NO);
  }
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_N == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_N), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_N);
  }
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_TRUE == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_TRUE), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_TRUE);
  }
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_FALSE == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_FALSE), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_FALSE);
  }
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_one == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_one), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_one);
  }
  if ((value_interpreter<bool,false>::
       interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
       ::s_zero == '\0') &&
     (iVar2 = __cxa_guard_acquire(&value_interpreter<bool,false>::
                                   interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                                   ::s_zero), iVar2 != 0)) {
    unit_test::basic_cstring<const_char>::basic_cstring
              (in_stack_fffffffffffffe10,(pointer)in_stack_fffffffffffffe08);
    __cxa_guard_release(&value_interpreter<bool,false>::
                         interpret(boost::unit_test::basic_cstring<char_const>,boost::unit_test::basic_cstring<char_const>)
                         ::s_zero);
  }
  unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffdf0);
  unit_test::basic_cstring<const_char>::trim(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  bVar1 = unit_test::basic_cstring<const_char>::is_empty(in_RDX);
  if (!bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(local_50,in_RDX);
    unit_test::basic_cstring<const_char>::basic_cstring(&local_60,&interpret::s_YES);
    bVar1 = unit_test::case_ins_eq<char_const>(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if (!bVar1) {
      unit_test::basic_cstring<const_char>::basic_cstring(&local_70,in_RDX);
      unit_test::basic_cstring<const_char>::basic_cstring(&local_80,&interpret::s_Y);
      bVar1 = unit_test::case_ins_eq<char_const>
                        (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      if (!bVar1) {
        unit_test::basic_cstring<const_char>::basic_cstring(&local_90,in_RDX);
        unit_test::basic_cstring<const_char>::basic_cstring(&local_a0,&interpret::s_one);
        bVar1 = unit_test::case_ins_eq<char_const>
                          (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        if (!bVar1) {
          unit_test::basic_cstring<const_char>::basic_cstring(&local_b0,in_RDX);
          unit_test::basic_cstring<const_char>::basic_cstring(&local_c0,&interpret::s_TRUE);
          bVar1 = unit_test::case_ins_eq<char_const>
                            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          if (!bVar1) {
            unit_test::basic_cstring<const_char>::basic_cstring(&local_d0,in_RDX);
            unit_test::basic_cstring<const_char>::basic_cstring(&local_e0,&interpret::s_NO);
            bVar1 = unit_test::case_ins_eq<char_const>
                              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
            if (!bVar1) {
              unit_test::basic_cstring<const_char>::basic_cstring(&local_f0,in_RDX);
              unit_test::basic_cstring<const_char>::basic_cstring(&local_100,&interpret::s_N);
              bVar1 = unit_test::case_ins_eq<char_const>
                                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              if (!bVar1) {
                unit_test::basic_cstring<const_char>::basic_cstring(&local_110,in_RDX);
                unit_test::basic_cstring<const_char>::basic_cstring(&local_120,&interpret::s_zero);
                bVar1 = unit_test::case_ins_eq<char_const>
                                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                if (!bVar1) {
                  unit_test::basic_cstring<const_char>::basic_cstring(&local_130,in_RDX);
                  unit_test::basic_cstring<const_char>::basic_cstring
                            (&local_140,&interpret::s_FALSE);
                  bVar1 = unit_test::case_ins_eq<char_const>
                                    (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
                  if (!bVar1) {
                    unit_test::basic_cstring<const_char>::basic_cstring
                              ((basic_cstring<const_char> *)&stack0xfffffffffffffe08,in_RSI);
                    format_error::format_error((format_error *)in_RDX,in_RSI);
                    specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::
                    operator<<(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
                    specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                    ::operator<<(in_stack_fffffffffffffe08,(char *)in_RDX);
                    unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                              ((format_error *)in_RDX);
                  }
                }
              }
            }
            return false;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool    interpret( cstring param_name, cstring source ) const
    {
        static cstring const s_YES( "YES" );
        static cstring const s_Y( "Y" );
        static cstring const s_NO( "NO" );
        static cstring const s_N( "N" );
        static cstring const s_TRUE( "TRUE" );
        static cstring const s_FALSE( "FALSE" );
        static cstring const s_one( "1" );
        static cstring const s_zero( "0" );

        source.trim();

        if( source.is_empty() ||
            case_ins_eq( source, s_YES ) ||
            case_ins_eq( source, s_Y ) ||
            case_ins_eq( source, s_one ) ||
            case_ins_eq( source, s_TRUE ) )
            return true;

        if( case_ins_eq( source, s_NO ) ||
            case_ins_eq( source, s_N ) ||
            case_ins_eq( source, s_zero ) ||
            case_ins_eq( source, s_FALSE ) )
            return false;

        BOOST_TEST_I_THROW( format_error( param_name ) << source << " can't be interpreted as bool value." );
    }